

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.cpp
# Opt level: O1

void __thiscall CNscPStackEntry::PushConstantLocation(CNscPStackEntry *this,int nValue)

{
  uchar *puVar1;
  uchar *puVar2;
  size_t sVar3;
  
  MakeRoom(this,0x18);
  puVar2 = this->m_pauchData;
  sVar3 = this->m_nDataSize;
  puVar1 = puVar2 + sVar3;
  puVar1[0] = '\x18';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1 = puVar2 + sVar3 + 8;
  puVar1[0] = '4';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\x12';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  *(int *)(puVar2 + sVar3 + 0x10) = nValue;
  this->m_nDataSize = sVar3 + 0x18;
  return;
}

Assistant:

void CNscPStackEntry::PushConstantLocation (int nValue)
{

	//
	// Make room for the pcode block
	//

	size_t nSize = sizeof (NscPCodeConstantInteger);
	MakeRoom (nSize);

	//
	// Initialize the block
	//

	NscPCodeConstantInteger *p = (NscPCodeConstantInteger *) 
		&m_pauchData [m_nDataSize];
	p ->nOpSize = nSize;
	p ->nOpCode = NscPCode_Constant;
	p ->nType = NscType_Engine_2;
	p ->lValue = nValue;

	//
	// Adjust the size of the entry
	//

	m_nDataSize += nSize;
}